

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::CallExpression::getEffectiveWidthImpl(CallExpression *this)

{
  int iVar1;
  bitwidth_t bVar2;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar3;
  uint extraout_var;
  byte bVar5;
  ulong uVar6;
  ulong uVar4;
  
  if ((this->subroutine).
      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      .
      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
      ._M_index == '\x01') {
    pvVar3 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    iVar1 = (*((pvVar3->subroutine).ptr)->_vptr_SystemSubroutine[6])();
    uVar4 = CONCAT44(extraout_var,iVar1);
    uVar6 = (ulong)(extraout_var >> 8);
    if ((extraout_var & 1) != 0) {
      bVar5 = (byte)extraout_var;
      goto LAB_00623a05;
    }
  }
  else {
    uVar6 = 0;
  }
  bVar2 = Type::getBitWidth((this->super_Expression).type.ptr);
  uVar4 = (ulong)bVar2;
  bVar5 = 1;
LAB_00623a05:
  return (optional<unsigned_int>)(uVar4 & 0xffffffff | (ulong)bVar5 << 0x20 | uVar6 << 0x28);
}

Assistant:

std::optional<bitwidth_t> CallExpression::getEffectiveWidthImpl() const {
    if (isSystemCall()) {
        auto& callInfo = std::get<1>(subroutine);
        if (auto result = callInfo.subroutine->getEffectiveWidth())
            return result;
    }
    return type->getBitWidth();
}